

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O2

void Imf_3_2::anon_unknown_0::hufCanonicalCodeTable(uint64_t *hcode)

{
  long lVar1;
  int i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong auStack_1d8 [59];
  
  for (lVar2 = 0; lVar2 != 0x3b; lVar2 = lVar2 + 1) {
    auStack_1d8[lVar2] = 0;
  }
  for (lVar2 = 0; lVar2 != 0x10001; lVar2 = lVar2 + 1) {
    auStack_1d8[hcode[lVar2]] = auStack_1d8[hcode[lVar2]] + 1;
  }
  uVar3 = 0;
  for (lVar2 = 0x1d0; lVar2 != 0; lVar2 = lVar2 + -8) {
    lVar1 = *(long *)((long)auStack_1d8 + lVar2);
    *(ulong *)((long)auStack_1d8 + lVar2) = uVar3;
    uVar3 = lVar1 + uVar3 >> 1;
  }
  for (lVar2 = 0; lVar2 != 0x10001; lVar2 = lVar2 + 1) {
    if (0 < (int)(uint)hcode[lVar2]) {
      uVar4 = (ulong)((uint)hcode[lVar2] & 0x7fffffff);
      uVar3 = auStack_1d8[uVar4];
      auStack_1d8[uVar4] = uVar3 + 1;
      hcode[lVar2] = uVar3 << 6 | uVar4;
    }
  }
  return;
}

Assistant:

void
hufCanonicalCodeTable (uint64_t hcode[HUF_ENCSIZE])
#endif
{
    uint64_t n[59];

    //
    // For each i from 0 through 58, count the
    // number of different codes of length i, and
    // store the count in n[i].
    //

    for (int i = 0; i <= 58; ++i)
        n[i] = 0;

    for (int i = 0; i < HUF_ENCSIZE; ++i)
        n[hcode[i]] += 1;

    //
    // For each i from 58 through 1, compute the
    // numerically lowest code with length i, and
    // store that code in n[i].
    //

    uint64_t c = 0;

    for (int i = 58; i > 0; --i)
    {
        uint64_t nc = ((c + n[i]) >> 1);
        n[i]        = c;
        c           = nc;
    }

    //
    // hcode[i] contains the length, l, of the
    // code for symbol i.  Assign the next available
    // code of length l to the symbol and store both
    // l and the code in hcode[i].
    //

    for (int i = 0; i < HUF_ENCSIZE; ++i)
    {
        int l = hcode[i];

        if (l > 0) hcode[i] = l | (n[l]++ << 6);
    }
}